

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

void os_print(char *str,size_t len)

{
  char cVar1;
  osgen_txtwin_t *poVar2;
  osgen_txtwin_t *win;
  char *pcVar3;
  char *pcVar4;
  
  win = S_status_win;
  poVar2 = S_default_win;
  if (status_mode == 1) {
    if ((os_f_plain == 0) && (S_status_win != (osgen_txtwin_t *)0x0)) {
      if (((S_status_win->base).winy == 0) || ((S_status_win->base).winx == 0)) {
        if (len != 0) {
          do {
            if (*str != '\n') {
              ossaddsb(S_status_win," ",1,1);
              pcVar3 = str;
              goto LAB_001e5d11;
            }
            str = str + 1;
            len = len - 1;
          } while (len != 0);
        }
      }
      else {
        pcVar4 = str;
        pcVar3 = str;
        if (len != 0) {
LAB_001e5d11:
          do {
            cVar1 = *pcVar3;
            if (cVar1 == '\x01') {
              pcVar3 = pcVar3 + 1;
              len = len - 1;
            }
            else if (cVar1 == '\x02') {
              pcVar3 = pcVar3 + 2;
              len = len - 2;
            }
            else {
              pcVar4 = pcVar3;
              if (cVar1 == '\n') break;
            }
            len = len - 1;
            pcVar4 = pcVar3 + 1;
            pcVar3 = pcVar3 + 1;
          } while (len != 0);
        }
        ossaddsb(win,str,(long)pcVar4 - (long)str,1);
        if (*pcVar4 == '\n') {
          os_status(2);
          return;
        }
      }
    }
  }
  else if (status_mode == 0) {
    if (os_f_plain != 0) {
      printf("%.*s",len & 0xffffffff,str);
      return;
    }
    if (((S_default_win != (osgen_txtwin_t *)0x0) &&
        (ossaddsb(S_default_win,str,len,1), S_deferred_redraw == '\0')) &&
       (((poVar2->base).flags & 4) == 0)) {
      ossloc(((poVar2->base).y + (poVar2->base).winy) - (poVar2->base).scrolly,
             ((poVar2->base).x + (poVar2->base).winx) - (poVar2->base).scrollx);
      return;
    }
  }
  return;
}

Assistant:

void os_print(const char *str, size_t len)
{
    osgen_txtwin_t *win;
    const char *p;
    const char *startp;
    size_t rem;

    /* determine what to do based on the status mode */
    switch(status_mode)
    {
    case 2:
        /* we're in the post-status-line mode - suppress all output */
        break; 
        
    case 0:
        /* we're showing the text in the default window */
        if (os_f_plain)
        {
            /* plain mode - simply write it to stdout */
            printf("%.*s", (int)len, str);
        }
        else
        {
            /* normal mode - write to the default window, if there is one */
            win = S_default_win;
            if (win != 0)
            {
                /* write the text to the window buffer */
                ossaddsb(win, str, len, TRUE);

                /* 
                 *   move the cursor to the new location, if we're not hiding
                 *   updates for the moment 
                 */
                if (!S_deferred_redraw
                    && !(win->base.flags & OSGEN_DEFER_REDRAW))
                    ossloc(win->base.winy + win->base.y - win->base.scrolly,
                           win->base.winx + win->base.x - win->base.scrollx);
            }
        }

        /* done */
        break;
        
    case 1:
        /* 
         *   Status line contents.  Ignore the status line in 'plain' mode
         *   or if there's no statusline window.  
         */
        if (os_f_plain || (win = S_status_win) == 0)
            break;

        /* 
         *   Skip leading newlines at the start of the statusline output.
         *   Only do this if we don't already have anything buffered, since
         *   a newline after some other text indicates the end of the status
         *   line and thus can't be ignored.  
         */
        p = str;
        rem = len;
        if (win->base.winy == 0 || win->base.winx == 0)
        {
            /* the buffer is empty, so skip leading newlines */
            for ( ; rem != 0 && *p == '\n' ; ++p, --rem) ;

            /* if that leaves nothing, we're done */
            if (rem == 0)
                break;

            /* 
             *   add a space before the first character, so that we always
             *   have a space at the left edge of the status line 
             */
            ossaddsb(win, " ", 1, TRUE);
        }

        /* scan for a newline; if we find one, it's the end of the status */
        for (startp = p ; rem != 0 && *p != '\n' ; ++p, --rem)
        {
            /* skip escapes */
            switch (*p)
            {
            case OSGEN_ATTR:
                /* skip the extra byte */
                p += 1;
                rem -= 1;
                break;
                
            case OSGEN_COLOR:
                /* skip the extra two bytes */
                p += 2;
                rem -= 2;
                break;

            default:
                /* everything else is one byte long */
                break;
            }
        }

        /* add this text to the statusline window */
        ossaddsb(win, startp, p - startp, TRUE);

        /* finish up if we found a newline */
        if (*p == '\n')
        {
            /* switch to status mode 2 */
            os_status(2);
        }
        
        /* done */
        break;
    }
}